

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O2

void __thiscall Assimp::ASE::Parser::ParseLV3MeshNormalListBlock(Parser *this,Mesh *sMesh)

{
  pointer pFVar1;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pvVar2;
  bool bVar3;
  int iVar4;
  Logger *pLVar5;
  byte *pbVar6;
  byte bVar7;
  ulong uVar8;
  ulong uVar9;
  uint index;
  int local_54;
  uint faceIdx;
  int local_4c;
  aiVector3t<float> local_48;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *local_38;
  
  local_38 = &(sMesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals;
  local_48.x = 0.0;
  local_48.y = 0.0;
  local_48.z = 0.0;
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
            (local_38,((long)(sMesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                             super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(sMesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                            super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x2c,&local_48);
  faceIdx = 0xffffffff;
  local_54 = 0;
  uVar8 = 0xffffffffffffffff;
LAB_003da4c9:
  uVar9 = uVar8 & 0xffffffff;
  local_4c = (int)uVar8 * 3;
LAB_003da4db:
  do {
    pbVar6 = (byte *)this->filePtr;
    bVar7 = *pbVar6;
    if (bVar7 != 0x2a) break;
    this->filePtr = (char *)(pbVar6 + 1);
    if (((int)uVar8 == -1) ||
       (bVar3 = TokenMatch<char_const>(&this->filePtr,"MESH_VERTEXNORMAL",0x11), !bVar3)) {
      bVar3 = TokenMatch<char_const>(&this->filePtr,"MESH_FACENORMAL",0xf);
      if (bVar3) {
        local_48.x = 0.0;
        local_48.y = 0.0;
        local_48.z = 0.0;
        ParseLV4MeshFloatTriple(this,&local_48.x,&faceIdx);
        pvVar2 = local_38;
        uVar8 = (ulong)faceIdx;
        if (uVar8 < (ulong)(((long)(sMesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                                   super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(sMesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                                  super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>
                                  ._M_impl.super__Vector_impl_data._M_start) / 0x84)) {
          aiVector3t<float>::operator+=
                    ((local_38->
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                     _M_impl.super__Vector_impl_data._M_start + faceIdx * 3,&local_48);
          aiVector3t<float>::operator+=
                    ((pvVar2->
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                     _M_impl.super__Vector_impl_data._M_start + (uVar8 * 3 + 1 & 0xffffffff),
                     &local_48);
          aiVector3t<float>::operator+=
                    ((pvVar2->
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                     _M_impl.super__Vector_impl_data._M_start + (uVar8 * 3 + 2 & 0xffffffff),
                     &local_48);
        }
        else {
          pLVar5 = DefaultLogger::get();
          Logger::error(pLVar5,"ASE: Invalid vertex index in MESH_FACENORMAL section");
        }
        goto LAB_003da4c9;
      }
      pbVar6 = (byte *)this->filePtr;
      bVar7 = *pbVar6;
      break;
    }
    local_48.x = 0.0;
    local_48.y = 0.0;
    local_48.z = 0.0;
    ParseLV4MeshFloatTriple(this,&local_48.x,&index);
    pFVar1 = (sMesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
             super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (uVar9 < (ulong)(((long)(sMesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                               super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar1) / 0x84)) {
      if (index == pFVar1[uVar9].super_FaceWithSmoothingGroup.mIndices[0]) {
        index = 0;
        iVar4 = 0;
      }
      else if (index == pFVar1[uVar9].super_FaceWithSmoothingGroup.mIndices[1]) {
        index = 1;
        iVar4 = 1;
      }
      else {
        if (index != pFVar1[uVar9].super_FaceWithSmoothingGroup.mIndices[2]) {
          pLVar5 = DefaultLogger::get();
          Logger::error(pLVar5,"ASE: Invalid vertex index in MESH_VERTEXNORMAL section");
          goto LAB_003da4db;
        }
        index = 2;
        iVar4 = 2;
      }
      aiVector3t<float>::operator+=
                ((local_38->
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl
                 .super__Vector_impl_data._M_start + (uint)(iVar4 + local_4c),&local_48);
    }
  } while( true );
  iVar4 = local_54;
  if ((bVar7 - 0xc < 2) || (bVar7 == 10)) {
    if (this->bLastWasEndLine == false) {
      this->iLineNumber = this->iLineNumber + 1;
      bVar3 = true;
      goto LAB_003da6ac;
    }
  }
  else if (bVar7 == 0x7b) {
    iVar4 = local_54 + 1;
  }
  else if (bVar7 == 0x7d) {
    iVar4 = local_54 + -1;
    if (local_54 + -1 == 0) {
      this->filePtr = (char *)(pbVar6 + 1);
      SkipToNextToken(this);
      return;
    }
  }
  else if (bVar7 == 0) {
    LogError(this,"Encountered unexpected EOL while parsing a *MESH_NORMALS chunk (Level 3)");
  }
  local_54 = iVar4;
  bVar3 = false;
LAB_003da6ac:
  this->bLastWasEndLine = bVar3;
  this->filePtr = (char *)(pbVar6 + 1);
  goto LAB_003da4c9;
}

Assistant:

void Parser::ParseLV3MeshNormalListBlock(ASE::Mesh& sMesh)
{
    AI_ASE_PARSER_INIT();

    // Allocate enough storage for the normals
    sMesh.mNormals.resize(sMesh.mFaces.size()*3,aiVector3D( 0.f, 0.f, 0.f ));
    unsigned int index, faceIdx = UINT_MAX;

    // FIXME: rewrite this and find out how to interpret the normals
    // correctly. This is crap.

    // Smooth the vertex and face normals together. The result
    // will be edgy then, but otherwise everything would be soft ...
    while (true)    {
        if ('*' == *filePtr)    {
            ++filePtr;
            if (faceIdx != UINT_MAX && TokenMatch(filePtr,"MESH_VERTEXNORMAL",17))  {
                aiVector3D vNormal;
                ParseLV4MeshFloatTriple(&vNormal.x,index);
                if (faceIdx >=  sMesh.mFaces.size())
                    continue;

                // Make sure we assign it to the correct face
                const ASE::Face& face = sMesh.mFaces[faceIdx];
                if (index == face.mIndices[0])
                    index = 0;
                else if (index == face.mIndices[1])
                    index = 1;
                else if (index == face.mIndices[2])
                    index = 2;
                else    {
                    ASSIMP_LOG_ERROR("ASE: Invalid vertex index in MESH_VERTEXNORMAL section");
                    continue;
                }
                // We'll renormalize later
                sMesh.mNormals[faceIdx*3+index] += vNormal;
                continue;
            }
            if (TokenMatch(filePtr,"MESH_FACENORMAL",15))   {
                aiVector3D vNormal;
                ParseLV4MeshFloatTriple(&vNormal.x,faceIdx);

                if (faceIdx >= sMesh.mFaces.size()) {
                    ASSIMP_LOG_ERROR("ASE: Invalid vertex index in MESH_FACENORMAL section");
                    continue;
                }

                // We'll renormalize later
                sMesh.mNormals[faceIdx*3] += vNormal;
                sMesh.mNormals[faceIdx*3+1] += vNormal;
                sMesh.mNormals[faceIdx*3+2] += vNormal;
                continue;
            }
        }
        AI_ASE_HANDLE_SECTION("3","*MESH_NORMALS");
    }
    return;
}